

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

int __thiscall
testing::internal::FunctionMocker<int_()>::PerformAction
          (FunctionMocker<int_()> *this,void *untyped_action,ArgumentTuple *args,
          string *call_description)

{
  Result RVar1;
  Result RVar2;
  Action<int_()> action;
  function<int_()> fStack_28;
  
  if (untyped_action != (void *)0x0) {
    std::function<int_()>::function(&fStack_28,(function<int_()> *)untyped_action);
    RVar1 = Action<int_()>::Perform((Action<int_()> *)&fStack_28);
    std::_Function_base::~_Function_base(&fStack_28.super__Function_base);
    return RVar1;
  }
  RVar2 = PerformDefaultAction(this,args,call_description);
  return RVar2;
}

Assistant:

R PerformAction(const void* untyped_action, ArgumentTuple&& args,
                  const std::string& call_description) const {
    if (untyped_action == nullptr) {
      return PerformDefaultAction(std::move(args), call_description);
    }

    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    return action.Perform(std::move(args));
  }